

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::MainBuilder::Impl::Arg> * __thiscall
kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>::operator=
          (ArrayBuilder<kj::MainBuilder::Impl::Arg> *this,
          ArrayBuilder<kj::MainBuilder::Impl::Arg> *other)

{
  ArrayBuilder<kj::MainBuilder::Impl::Arg> *other_local;
  ArrayBuilder<kj::MainBuilder::Impl::Arg> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Arg *)0x0;
  other->pos = (RemoveConst<kj::MainBuilder::Impl::Arg> *)0x0;
  other->endPtr = (Arg *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }